

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockComparatorCopierTest.cpp
# Opt level: O0

void __thiscall
TEST_MockComparatorCopierTest_customObjectWithFunctionComparatorThatFailsCoversValueToString_Test::
testBody(TEST_MockComparatorCopierTest_customObjectWithFunctionComparatorThatFailsCoversValueToString_Test
         *this)

{
  int iVar1;
  MockSupport *pMVar2;
  MockCheckedExpectedCall *pMVar3;
  UtestShell *test;
  undefined4 extraout_var;
  SimpleString local_168;
  SimpleString local_158;
  SimpleString local_148;
  SimpleString local_138;
  SimpleString local_128;
  undefined1 local_118 [8];
  MockExpectedCallsDidntHappenFailure failure;
  SimpleString local_a0;
  SimpleString local_90;
  undefined1 local_80 [8];
  MockExpectedCallsListForTest expectations;
  SimpleString local_60;
  undefined1 local_50 [8];
  MockFunctionComparator comparator;
  undefined1 local_28 [8];
  MyTypeForTesting object;
  MockFailureReporterInstaller failureReporterInstaller;
  TEST_MockComparatorCopierTest_customObjectWithFunctionComparatorThatFailsCoversValueToString_Test
  *this_local;
  
  MockFailureReporterInstaller::MockFailureReporterInstaller
            ((MockFailureReporterInstaller *)((long)&object.value + 7));
  MyTypeForTesting::MyTypeForTesting((MyTypeForTesting *)local_28,5);
  MockFunctionComparator::MockFunctionComparator
            ((MockFunctionComparator *)local_50,myTypeIsEqual,myTypeValueToString);
  SimpleString::SimpleString(&local_60,"");
  pMVar2 = mock(&local_60,(MockFailureReporter *)0x0);
  SimpleString::SimpleString
            ((SimpleString *)&expectations.super_MockExpectedCallsList.head_,"MyTypeForTesting");
  (*pMVar2->_vptr_MockSupport[0x2c])
            (pMVar2,&expectations.super_MockExpectedCallsList.head_,local_50);
  SimpleString::~SimpleString((SimpleString *)&expectations.super_MockExpectedCallsList.head_);
  SimpleString::~SimpleString(&local_60);
  MockExpectedCallsListForTest::MockExpectedCallsListForTest
            ((MockExpectedCallsListForTest *)local_80);
  SimpleString::SimpleString(&local_90,"function");
  pMVar3 = MockExpectedCallsListForTest::addFunction
                     ((MockExpectedCallsListForTest *)local_80,&local_90);
  SimpleString::SimpleString(&local_a0,"MyTypeForTesting");
  SimpleString::SimpleString
            ((SimpleString *)&failure.super_MockFailure.super_TestFailure.message_.bufferSize_,
             "parameterName");
  (*(pMVar3->super_MockExpectedCall)._vptr_MockExpectedCall[5])
            (pMVar3,&local_a0,&failure.super_MockFailure.super_TestFailure.message_.bufferSize_,
             local_28);
  SimpleString::~SimpleString
            ((SimpleString *)&failure.super_MockFailure.super_TestFailure.message_.bufferSize_);
  SimpleString::~SimpleString(&local_a0);
  SimpleString::~SimpleString(&local_90);
  test = UtestShell::getCurrent();
  MockExpectedCallsDidntHappenFailure::MockExpectedCallsDidntHappenFailure
            ((MockExpectedCallsDidntHappenFailure *)local_118,test,(MockExpectedCallsList *)local_80
            );
  SimpleString::SimpleString(&local_128,"");
  pMVar2 = mock(&local_128,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_138,"function");
  iVar1 = (*pMVar2->_vptr_MockSupport[3])(pMVar2,&local_138);
  SimpleString::SimpleString(&local_148,"MyTypeForTesting");
  SimpleString::SimpleString(&local_158,"parameterName");
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x28))
            ((long *)CONCAT44(extraout_var,iVar1),&local_148,&local_158,local_28);
  SimpleString::~SimpleString(&local_158);
  SimpleString::~SimpleString(&local_148);
  SimpleString::~SimpleString(&local_138);
  SimpleString::~SimpleString(&local_128);
  SimpleString::SimpleString(&local_168,"");
  pMVar2 = mock(&local_168,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x25])();
  SimpleString::~SimpleString(&local_168);
  CHECK_EXPECTED_MOCK_FAILURE_LOCATION
            ((MockFailure *)local_118,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
             ,0x9f);
  MockExpectedCallsDidntHappenFailure::~MockExpectedCallsDidntHappenFailure
            ((MockExpectedCallsDidntHappenFailure *)local_118);
  MockExpectedCallsListForTest::~MockExpectedCallsListForTest
            ((MockExpectedCallsListForTest *)local_80);
  MockFunctionComparator::~MockFunctionComparator((MockFunctionComparator *)local_50);
  MyTypeForTesting::~MyTypeForTesting((MyTypeForTesting *)local_28);
  MockFailureReporterInstaller::~MockFailureReporterInstaller
            ((MockFailureReporterInstaller *)((long)&object.value + 7));
  return;
}

Assistant:

TEST(MockComparatorCopierTest, customObjectWithFunctionComparatorThatFailsCoversValueToString)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MyTypeForTesting object(5);
    MockFunctionComparator comparator(myTypeIsEqual, myTypeValueToString);
    mock().installComparator("MyTypeForTesting", comparator);

    MockExpectedCallsListForTest expectations;
    expectations.addFunction("function")->withParameterOfType("MyTypeForTesting", "parameterName", &object);
    MockExpectedCallsDidntHappenFailure failure(UtestShell::getCurrent(), expectations);

    mock().expectOneCall("function").withParameterOfType("MyTypeForTesting", "parameterName", &object);
    mock().checkExpectations();

    CHECK_EXPECTED_MOCK_FAILURE_LOCATION(failure, __FILE__, __LINE__);
}